

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O1

void __thiscall USBControlTransferParser::ParseCDCDataStage(USBControlTransferParser *this)

{
  byte bVar1;
  U16 UVar2;
  pointer puVar3;
  int iVar4;
  byte bVar5;
  unsigned_long_long uStack_40;
  unsigned_long_long uStack_38;
  ulong uStack_30;
  char *pcStack_28;
  undefined2 uStack_20;
  
  bVar1 = (this->mRequest).bRequest;
  bVar5 = bVar1 & 0xfe;
  if (bVar5 == 0x30) {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCRingerConfigFields);
    return;
  }
  if (bVar5 == 0x20) {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCLineCodingFields);
    return;
  }
  if (bVar5 != 2) {
    if (bVar1 == 0x33) {
      this->mDescBytes = (uint)(this->mRequest).wLength;
      this->mParsedOffset = 0;
      ParseStructure(this,CDCOperationModeFields);
      return;
    }
    if (bVar5 == 0x34) {
      this->mDescBytes = (uint)(this->mRequest).wLength;
      this->mParsedOffset = 0;
      ParseStructure(this,CDCLineParmsFields);
      return;
    }
    if ((byte)(bVar1 - 0x37) < 2) {
      this->mDescBytes = (uint)(this->mRequest).wLength;
      this->mParsedOffset = 0;
      ParseStructure(this,CDCUnitParameterFields);
      return;
    }
    if (bVar1 < 0x52) {
      if ((bVar1 != 0x44) && (bVar1 != 0x51)) goto USBControlTransferParser_ParseUnknownResponse;
    }
    else {
      if (bVar1 == 0x52) {
        this->mDescBytes = (uint)(this->mRequest).wLength;
        this->mParsedOffset = 0;
        ParseStructure(this,CDCATMDefaultVCFields);
        return;
      }
      if (bVar1 != 0x53) goto USBControlTransferParser_ParseUnknownResponse;
    }
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCUnsignedIntFields);
    return;
  }
  this->mDescBytes = (uint)(this->mRequest).wLength;
  this->mParsedOffset = 0;
  UVar2 = (this->mRequest).wValue;
  if (UVar2 == 2) {
    ParseStructure(this,CDCCountrySettingFields);
    return;
  }
  if (UVar2 == 1) {
    ParseStructure(this,CDCAbstractStateFields);
    return;
  }
USBControlTransferParser_ParseUnknownResponse:
  Frame::Frame((Frame *)&uStack_40);
  uStack_20 = 0xd;
  iVar4 = this->mPacketOffset;
  if (iVar4 < this->mPacketDataBytes) {
    do {
      puVar3 = (this->pPacket->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uStack_40 = puVar3[iVar4 * 8 + 0x10];
      uStack_38 = puVar3[iVar4 * 8 + 0x18];
      uStack_30 = (ulong)this->mAddress << 0x30 |
                  (ulong)(this->pPacket->mData).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)iVar4 + 2] | 0x100000000;
      pcStack_28 = "byte";
      AnalyzerResults::AddFrame((Frame *)this->pResults);
      iVar4 = this->mPacketOffset + 1;
      this->mPacketOffset = iVar4;
      this->mParsedOffset = this->mParsedOffset + 1;
    } while (iVar4 < this->mPacketDataBytes);
  }
  Frame::~Frame((Frame *)&uStack_40);
  return;
}

Assistant:

void USBControlTransferParser::ParseCDCDataStage()
{
    USBCDCRequestCode reqCode = ( USBCDCRequestCode )mRequest.bRequest;

    if( reqCode == GET_COMM_FEATURE || reqCode == SET_COMM_FEATURE )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;

        if( mRequest.wValue == 1 ) // ABSTRACT_STATE
            ParseStructure( CDCAbstractStateFields );
        else if( mRequest.wValue == 2 ) // COUNTRY_SETTING
            ParseStructure( CDCCountrySettingFields );
        else
            ParseUnknownResponse();
    }
    else if( reqCode == SET_LINE_CODING || reqCode == GET_LINE_CODING )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCLineCodingFields );
    }
    else if( reqCode == SET_RINGER_PARMS || reqCode == GET_RINGER_PARMS )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCRingerConfigFields );
    }
    else if( reqCode == GET_OPERATION_PARMS )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCOperationModeFields );
    }
    else if( reqCode == SET_LINE_PARMS || reqCode == GET_LINE_PARMS )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCLineParmsFields );
    }
    else if( reqCode == SET_UNIT_PARAMETER || reqCode == GET_UNIT_PARAMETER )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCUnitParameterFields );
    }
    else if( reqCode == GET_ETHERNET_STATISTIC || reqCode == GET_ATM_DEVICE_STATISTICS || reqCode == GET_ATM_VC_STATISTICS )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCUnsignedIntFields );
    }
    else if( reqCode == SET_ATM_DEFAULT_VC )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCATMDefaultVCFields );
    }
    else
    {
        ParseUnknownResponse();
    }
}